

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

bool __thiscall antlr::BaseAST::equalsList(BaseAST *this,RefAST *t)

{
  int iVar1;
  AST *pAVar2;
  AST *pAVar3;
  ASTRefCount *in_RSI;
  bool bVar4;
  RefAST sibling;
  AST *in_stack_fffffffffffffef8;
  AST *in_stack_ffffffffffffff00;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff10;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  ASTRefCount local_60 [8];
  undefined1 local_58 [8];
  ASTRefCount<antlr::AST> local_50;
  ASTRefCount local_48 [12];
  undefined4 local_3c;
  undefined1 local_38 [24];
  ASTRefCount<antlr::AST> local_20 [3];
  byte local_1;
  
  pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar2 != (AST *)0x0) {
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    do {
      pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)local_20);
      bVar4 = false;
      if (pAVar2 != (AST *)0x0) {
        pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
        bVar4 = pAVar2 != (AST *)0x0;
      }
      if (!bVar4) {
        pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)local_20);
        if ((pAVar2 == (AST *)0x0) &&
           (pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI), pAVar2 == (AST *)0x0)) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
        goto LAB_001bfcaf;
      }
      pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
      ASTRefCount<antlr::AST>::ASTRefCount
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00,
                 (ASTRefCount<antlr::AST> *)in_stack_fffffffffffffef8);
      iVar1 = (*pAVar2->_vptr_AST[4])(pAVar2,local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
      if ((((byte)iVar1 ^ 0xff) & 1) != 0) {
        local_1 = 0;
        goto LAB_001bfcaf;
      }
      pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
      (*pAVar2->_vptr_AST[0xd])(local_48);
      pAVar2 = ASTRefCount::operator_cast_to_AST_(local_48);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
      if (pAVar2 == (AST *)0x0) {
        pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
        (*pAVar2->_vptr_AST[0xd])(local_60);
        pAVar2 = ASTRefCount::operator_cast_to_AST_(local_60);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
        if (pAVar2 != (AST *)0x0) {
          local_1 = 0;
          goto LAB_001bfcaf;
        }
        in_stack_ffffffffffffff10 = (ASTRefCount<antlr::AST> *)0x0;
      }
      else {
        pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
        (*pAVar2->_vptr_AST[0xd])(&local_50);
        pAVar2 = ASTRefCount<antlr::AST>::operator->(&local_50);
        pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
        (*pAVar3->_vptr_AST[0xd])(local_58);
        iVar1 = (*pAVar2->_vptr_AST[5])(pAVar2,local_58);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
        if ((((byte)iVar1 ^ 0xff) & 1) != 0) goto LAB_001bfa38;
      }
      pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
      (*pAVar2->_vptr_AST[0xe])(local_68);
      ASTRefCount<antlr::AST>::operator=
                (in_stack_ffffffffffffff10,(ASTRefCount<antlr::AST> *)pAVar2);
      in_stack_ffffffffffffff00 =
           ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
      (*in_stack_ffffffffffffff00->_vptr_AST[0xe])(local_70);
      ASTRefCount<antlr::AST>::operator=
                (in_stack_ffffffffffffff10,(ASTRefCount<antlr::AST> *)pAVar2);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
    } while( true );
  }
  local_1 = 0;
LAB_001bfccd:
  return (bool)(local_1 & 1);
LAB_001bfa38:
  local_1 = 0;
LAB_001bfcaf:
  local_3c = 1;
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff00);
  goto LAB_001bfccd;
}

Assistant:

bool BaseAST::equalsList(RefAST t) const
{
	// the empty tree is not a match of any non-null tree.
	if (!t)
		return false;

	// Otherwise, start walking sibling lists.  First mismatch, return false.
	RefAST sibling=this;
	for (;sibling && t;
			sibling=sibling->getNextSibling(), t=t->getNextSibling()) {
		// as a quick optimization, check roots first.
		if (!sibling->equals(t))
			return false;
		// if roots match, do full list match test on children.
		if (sibling->getFirstChild()) {
			if (!sibling->getFirstChild()->equalsList(t->getFirstChild()))
				return false;
		}
		// sibling has no kids, make sure t doesn't either
		else if (t->getFirstChild())
			return false;
	}

	if (!sibling && !t)
		return true;

	// one sibling list has more than the other
	return false;
}